

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall avro::NodeEnum::NodeEnum(NodeEnum *this,HasName *name,LeafNames *symbols)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  format *in_RDI;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  NoAttribute<boost::shared_ptr<avro::Node>_> *in_stack_fffffffffffffec8;
  SingleAttribute<avro::Name> *in_stack_fffffffffffffed0;
  ulong uVar4;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined1 uVar5;
  char *in_stack_ffffffffffffff08;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  ulong local_28;
  
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
              *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (Type)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0,
             (NoAttribute<int> *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  (in_RDI->items_).
  super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__NodeEnum_00264d40;
  local_28 = 0;
  while( true ) {
    uVar4 = local_28;
    sVar2 = concepts::
            MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x1f09e0);
    if (sVar2 <= uVar4) {
      return;
    }
    concepts::
    MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::get((MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    bVar1 = concepts::
            NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  uVar5 = 1;
  uVar3 = __cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  concepts::
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  get((MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Exception::Exception((Exception *)CONCAT17(uVar5,in_stack_fffffffffffffee0),in_RDI);
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

NodeEnum(const HasName &name, const LeafNames &symbols) :
        NodeImplEnum(AVRO_ENUM, name, NoLeaves(), symbols, NoSize())
    { 
        for(size_t i=0; i < leafNameAttributes_.size(); ++i) {
            if(!nameIndex_.add(leafNameAttributes_.get(i), i)) {
                 throw Exception(boost::format("Cannot add duplicate name: %1%") % leafNameAttributes_.get(i));
            }
        }
    }